

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-feeder-c-impl.h
# Opt level: O2

void __thiscall
mp::NLW2_NLFeeder_C_Impl::
FeedColumnSizes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::ColSizeWriter>
          (NLW2_NLFeeder_C_Impl *this,ColSizeWriter *csw)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/api/c/nl-feeder-c-impl.h:341:35)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/api/c/nl-feeder-c-impl.h:341:35)>
             ::_M_manager;
  local_28._M_unused._M_object = csw;
  (*(this->nlf2_c_).FeedColumnSizes)((this->nlf2_c_).p_user_data_,&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void FeedColumnSizes(ColSizeWriter& csw) {
    assert(NLF().FeedColumnSizes);
    std::function<void(int )> f = [&csw](int cs) {
      csw.Write(cs);
    };
    NLF().FeedColumnSizes(NLF().p_user_data_, &f);
  }